

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O1

void plutovg_canvas_save(plutovg_canvas_t *canvas)

{
  int *piVar1;
  int iVar2;
  plutovg_state_t *ppVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  plutovg_line_cap_t pVar7;
  plutovg_line_join_t pVar8;
  uint uVar9;
  plutovg_state_t *ppVar10;
  plutovg_paint_t *ppVar11;
  plutovg_font_face_t *ppVar12;
  float *pfVar13;
  uint uVar14;
  
  ppVar10 = canvas->freed_state;
  if (ppVar10 == (plutovg_state_t *)0x0) {
    ppVar10 = plutovg_state_create();
  }
  else {
    canvas->freed_state = ppVar10->next;
  }
  ppVar3 = canvas->state;
  ppVar11 = plutovg_paint_reference(ppVar3->paint);
  ppVar10->paint = ppVar11;
  ppVar12 = plutovg_font_face_reference(ppVar3->font_face);
  ppVar10->font_face = ppVar12;
  fVar4 = (ppVar3->color).g;
  fVar5 = (ppVar3->color).b;
  fVar6 = (ppVar3->color).a;
  (ppVar10->color).r = (ppVar3->color).r;
  (ppVar10->color).g = fVar4;
  (ppVar10->color).b = fVar5;
  (ppVar10->color).a = fVar6;
  fVar4 = (ppVar3->matrix).f;
  (ppVar10->matrix).e = (ppVar3->matrix).e;
  (ppVar10->matrix).f = fVar4;
  fVar4 = (ppVar3->matrix).b;
  fVar5 = (ppVar3->matrix).c;
  fVar6 = (ppVar3->matrix).d;
  (ppVar10->matrix).a = (ppVar3->matrix).a;
  (ppVar10->matrix).b = fVar4;
  (ppVar10->matrix).c = fVar5;
  (ppVar10->matrix).d = fVar6;
  pVar7 = (ppVar3->stroke).style.cap;
  pVar8 = (ppVar3->stroke).style.join;
  fVar4 = (ppVar3->stroke).style.miter_limit;
  (ppVar10->stroke).style.width = (ppVar3->stroke).style.width;
  (ppVar10->stroke).style.cap = pVar7;
  (ppVar10->stroke).style.join = pVar8;
  (ppVar10->stroke).style.miter_limit = fVar4;
  (ppVar10->stroke).dash.offset = (ppVar3->stroke).dash.offset;
  (ppVar10->stroke).dash.array.size = 0;
  if (((ppVar3->stroke).dash.array.data != (float *)0x0) &&
     (iVar2 = (ppVar3->stroke).dash.array.size, 0 < iVar2)) {
    uVar14 = (ppVar10->stroke).dash.array.capacity;
    if ((int)uVar14 < iVar2) {
      uVar9 = 8;
      if (uVar14 != 0) {
        uVar9 = uVar14;
      }
      do {
        uVar14 = uVar9;
        uVar9 = uVar14 * 2;
      } while ((int)uVar14 < iVar2);
      pfVar13 = (float *)realloc((ppVar10->stroke).dash.array.data,(ulong)uVar14 << 2);
      (ppVar10->stroke).dash.array.data = pfVar13;
      (ppVar10->stroke).dash.array.capacity = uVar14;
    }
    memcpy((ppVar10->stroke).dash.array.data + (ppVar10->stroke).dash.array.size,
           (ppVar3->stroke).dash.array.data,(long)(ppVar3->stroke).dash.array.size << 2);
    piVar1 = &(ppVar10->stroke).dash.array.size;
    *piVar1 = *piVar1 + (ppVar3->stroke).dash.array.size;
  }
  plutovg_span_buffer_copy(&ppVar10->clip_spans,&ppVar3->clip_spans);
  ppVar10->winding = ppVar3->winding;
  ppVar10->op = ppVar3->op;
  ppVar10->font_size = ppVar3->font_size;
  ppVar10->opacity = ppVar3->opacity;
  ppVar10->clipping = ppVar3->clipping;
  ppVar10->next = canvas->state;
  canvas->state = ppVar10;
  return;
}

Assistant:

void plutovg_canvas_save(plutovg_canvas_t* canvas)
{
    plutovg_state_t* new_state = canvas->freed_state;
    if(new_state == NULL)
        new_state = plutovg_state_create();
    else
        canvas->freed_state = new_state->next;
    plutovg_state_copy(new_state, canvas->state);
    new_state->next = canvas->state;
    canvas->state = new_state;
}